

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O2

void __thiscall
Memory::RecyclerSweepManager::AddUnaccountedNewObjectAllocBytes<MediumAllocationBlockAttributes>
          (RecyclerSweepManager *this,SmallHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  
  if (this->recycler->inPartialCollectMode != true) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearAllAllocBytes(heapBlock);
    return;
  }
  uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAndClearUnaccountedAllocBytes
                    (heapBlock);
  uVar5 = heapBlock->lastUncollectedAllocBytes;
  if (uVar4 != 0 && uVar5 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x136,
                       "(heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0)",
                       "heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    uVar5 = heapBlock->lastUncollectedAllocBytes;
  }
  heapBlock->lastUncollectedAllocBytes = uVar5 + uVar4;
  psVar1 = &this->recycler->partialUncollectedAllocBytes;
  *psVar1 = *psVar1 + (ulong)uVar4;
  this->nextPartialUncollectedAllocBytes = this->nextPartialUncollectedAllocBytes + (ulong)uVar4;
  return;
}

Assistant:

void
RecyclerSweepManager::AddUnaccountedNewObjectAllocBytes(SmallHeapBlockT<TBlockAttributes> * heapBlock)
{
#if ENABLE_PARTIAL_GC
    // Only need to update the unaccounted alloc bytes if we are in partial collect mode
    if (recycler->inPartialCollectMode)
    {
        uint unaccountedAllocBytes = heapBlock->GetAndClearUnaccountedAllocBytes();
        Assert(heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0);
        DebugOnly(heapBlock->lastUncollectedAllocBytes += unaccountedAllocBytes);
        recycler->partialUncollectedAllocBytes += unaccountedAllocBytes;
        this->nextPartialUncollectedAllocBytes += unaccountedAllocBytes;
    }
    else
#endif
    {
        // We don't care, clear the unaccounted to start tracking for new object for next GC
        heapBlock->ClearAllAllocBytes();
    }
}